

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalysisScopeVisitor.h
# Opt level: O0

void __thiscall
slang::analysis::AnalysisScopeVisitor::visit
          (AnalysisScopeVisitor *this,WildcardImportSymbol *symbol)

{
  bitmask<slang::analysis::AnalysisFlags> flags;
  bool bVar1;
  pair<bool,_bool> pVar2;
  AnalysisScopeVisitor *this_00;
  type_conflict2 *ptVar3;
  SourceLocation location;
  Symbol *in_RSI;
  AnalysisManager *in_RDI;
  type_conflict2 *_;
  type_conflict2 *used;
  SyntaxNode *syntax;
  undefined4 in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffd8;
  bitmask<slang::analysis::AnalysisFlags> local_14;
  Symbol *local_10;
  
  flags.m_bits = (in_RDI->options).numThreads;
  local_10 = in_RSI;
  bitmask<slang::analysis::AnalysisFlags>::bitmask(&local_14,CheckUnused);
  bVar1 = AnalysisManager::hasFlag(in_RDI,flags);
  if ((bVar1) &&
     (this_00 = (AnalysisScopeVisitor *)ast::Symbol::getSyntax(local_10),
     this_00 != (AnalysisScopeVisitor *)0x0)) {
    pVar2 = isReferenced((AnalysisScopeVisitor *)in_RDI,(SyntaxNode *)0x7fd3bf);
    ptVar3 = std::get<0ul,bool,bool>((pair<bool,_bool> *)0x7fd3ce);
    location = (SourceLocation)std::get<1ul,bool,bool>((pair<bool,_bool> *)0x7fd3dd);
    if (((*ptVar3 & 1U) == 0) &&
       (bVar1 = shouldWarn(this_00,(Symbol *)CONCAT26(pVar2,in_stack_ffffffffffffffd8)), bVar1)) {
      AnalysisContext::addDiag
                ((AnalysisContext *)CONCAT44(0x2a000e,in_stack_ffffffffffffffc0),
                 (Symbol *)local_10->location,SUB84((ulong)ptVar3 >> 0x20,0),location);
    }
  }
  return;
}

Assistant:

void visit(const WildcardImportSymbol& symbol) {
        if (!manager.hasFlag(AnalysisFlags::CheckUnused))
            return;

        auto syntax = symbol.getSyntax();
        if (!syntax)
            return;

        auto [used, _] = isReferenced(*syntax);
        if (!used) {
            if (shouldWarn(symbol))
                context.addDiag(symbol, diag::UnusedWildcardImport, symbol.location);
        }
    }